

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix<Complex> __thiscall Matrix<Complex>::fromRow(Matrix<Complex> *this,string *s)

{
  istream *piVar1;
  Complex *extraout_RDX;
  uint uVar2;
  pointer __x;
  ulong uVar3;
  Complex *this_00;
  Matrix<Complex> MVar4;
  vector<Complex,_std::allocator<Complex>_> v;
  Complex f;
  istringstream iss;
  vector<Complex,_std::allocator<Complex>_> local_248;
  Complex local_228;
  istringstream local_1a8 [16];
  string local_198 [104];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a8);
  std::__cxx11::stringbuf::str(local_198);
  Complex::Complex(&local_228);
  local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while (piVar1 = operator>>((istream *)local_1a8,&local_228),
        ((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    std::vector<Complex,_std::allocator<Complex>_>::push_back(&local_248,&local_228);
  }
  if (local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Matrix(this,1,1);
  }
  else {
    Matrix(this,1,(uint)((ulong)((long)local_248.
                                       super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl
                                       .super__Vector_impl_data._M_finish -
                                (long)local_248.
                                      super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 7));
    if (local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar2 = 1;
      uVar3 = 0;
      do {
        __x = local_248.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
              super__Vector_impl_data._M_start + uVar3;
        this_00 = this->arr + uVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
        (this_00->_re)._numerator.negative = (__x->_re)._numerator.negative;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&(this_00->_re)._denominator.digits,&(__x->_re)._denominator.digits);
        (this_00->_re)._denominator.negative = (__x->_re)._denominator.negative;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this_00->_im,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__x->_im);
        (this_00->_im)._numerator.negative = (__x->_im)._numerator.negative;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&(this_00->_im)._denominator.digits,&(__x->_im)._denominator.digits);
        (this_00->_im)._denominator.negative = (__x->_im)._denominator.negative;
        uVar3 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar3 < (ulong)((long)local_248.super__Vector_base<Complex,_std::allocator<Complex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_248.super__Vector_base<Complex,_std::allocator<Complex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 7));
    }
  }
  std::vector<Complex,_std::allocator<Complex>_>::~vector(&local_248);
  if (local_228._im._denominator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228._im._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228._im._numerator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228._im._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228._re._denominator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228._re._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228._re._numerator.digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228._re._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  MVar4.arr = extraout_RDX;
  MVar4._0_8_ = this;
  return MVar4;
}

Assistant:

const Matrix<Field> Matrix<Field>::fromRow(const std::string &s)
{
    std::istringstream iss;
    iss.str(s);
    Field f;
    std::vector<Field> v;
    while(iss >> f)
        v.push_back(f);
    if(v.empty())
        return Matrix(1, 1);
    Matrix m(1, v.size());
    for(unsigned i = 0; i < v.size(); ++i)
        m[0][i] = v[i];
    return m;
}